

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

Var mapVar(Var x,vec<int> *map,Var *max)

{
  int iVar1;
  int local_1c;
  
  if ((map->sz <= x) || (iVar1 = map->data[x], iVar1 == -1)) {
    local_1c = -1;
    Gluco::vec<int>::growTo(map,x + 1,&local_1c);
    iVar1 = *max;
    *max = iVar1 + 1;
    map->data[x] = iVar1;
  }
  return iVar1;
}

Assistant:

static Var mapVar(Var x, vec<Var>& map, Var& max)
{
    if (map.size() <= x || map[x] == -1){
        map.growTo(x+1, -1);
        map[x] = max++;
    }
    return map[x];
}